

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O1

bool __thiscall
cmFunctionCommand::InitialPass
          (cmFunctionCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pbVar2;
  cmFunctionBlocker *fb;
  string local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar1) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    fb = (cmFunctionBlocker *)operator_new(0x88);
    (fb->StartingContext).Name._M_dataplus._M_p = (pointer)&(fb->StartingContext).Name.field_2;
    (fb->StartingContext).Name._M_string_length = 0;
    (fb->StartingContext).Name.field_2._M_local_buf[0] = '\0';
    (fb->StartingContext).FilePath._M_dataplus._M_p =
         (pointer)&(fb->StartingContext).FilePath.field_2;
    (fb->StartingContext).FilePath._M_string_length = 0;
    (fb->StartingContext).FilePath.field_2._M_local_buf[0] = '\0';
    (fb->StartingContext).Line = 0;
    fb->_vptr_cmFunctionBlocker = (_func_int **)&PTR_IsFunctionBlocked_005cacd0;
    fb[1]._vptr_cmFunctionBlocker = (_func_int **)0x0;
    fb[1].StartingContext.Name._M_dataplus._M_p = (pointer)0x0;
    fb[1].StartingContext.Name._M_string_length = 0;
    fb[1].StartingContext.Name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&fb[1].StartingContext.Name.field_2 + 8) = 0;
    fb[1].StartingContext.FilePath._M_dataplus._M_p = (pointer)0x0;
    *(undefined4 *)&fb[1].StartingContext.FilePath._M_string_length = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(fb + 1),
               fb[1].StartingContext.Name._M_dataplus._M_p,pbVar1,pbVar2);
    cmMakefile::AddFunctionBlocker((this->super_cmCommand).Makefile,fb);
  }
  return pbVar2 != pbVar1;
}

Assistant:

bool cmFunctionCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // create a function blocker
  cmFunctionFunctionBlocker *f = new cmFunctionFunctionBlocker();
  f->Args.insert(f->Args.end(), args.begin(), args.end());
  this->Makefile->AddFunctionBlocker(f);
  return true;
}